

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O1

LispPTR N_OP_llsh1(LispPTR a)

{
  uint *puVar1;
  uint uVar2;
  
  if ((a & 0xfff0000) == 0xf0000) {
    uVar2 = a | 0xffff0000;
  }
  else if ((a & 0xfff0000) == 0xe0000) {
    uVar2 = a & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(a >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = a;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((a & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)a);
    }
    uVar2 = *(uint *)(Lisp_world + a);
  }
  uVar2 = uVar2 * 2;
  if ((uVar2 & 0xffff0000) == 0xffff0000) {
    uVar2 = uVar2 & 0xfffe | 0xf0000;
  }
  else if ((uVar2 & 0xffff0000) == 0) {
    uVar2 = uVar2 | 0xe0000;
  }
  else {
    puVar1 = (uint *)createcell68k(2);
    *puVar1 = uVar2;
    if (((ulong)puVar1 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",puVar1);
    }
    uVar2 = (uint)((ulong)((long)puVar1 - (long)Lisp_world) >> 1);
  }
  return uVar2;
}

Assistant:

LispPTR N_OP_llsh1(LispPTR a) {
  int arg1;

  N_GETNUMBER(a, arg1, du_ufn);
  arg1 <<= 1;
  N_ARITH_SWITCH(arg1);

 du_ufn:
  ERROR_EXIT(a);
}